

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O2

int setup_listener(void)

{
  FILE *pFVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int one;
  sockaddr_in sin;
  
  one = 1;
  __fd = socket(2,1,0);
  pFVar1 = _stderr;
  if (__fd == -1) {
    piVar3 = __errno_location();
    pcVar5 = strerror(*piVar3);
    fprintf(pFVar1,"socket: %s\n",pcVar5);
  }
  else {
    sin.sin_family = 2;
    sin.sin_addr.s_addr = cfg.addr;
    sin.sin_port = (ushort)cfg.port << 8 | (ushort)cfg.port >> 8;
    setsockopt(__fd,1,2,&one,4);
    iVar2 = bind(__fd,(sockaddr *)&sin,0x10);
    if (iVar2 == -1) {
      pcVar5 = "bind: %s\n";
    }
    else {
      iVar2 = listen(__fd,1);
      if (iVar2 != -1) {
        cfg.listener_fd = __fd;
        return 0;
      }
      pcVar5 = "listen: %s\n";
    }
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,pcVar5,pcVar4);
    close(__fd);
  }
  return -1;
}

Assistant:

int setup_listener() {
  int rc = -1, one=1;

  int fd = socket(AF_INET, SOCK_STREAM, 0);
  if (fd == -1) {
    fprintf(stderr,"socket: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * internet socket address structure: our address and port
   *********************************************************/
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = cfg.addr;
  sin.sin_port = htons(cfg.port);

  /**********************************************************
   * bind socket to address and port 
   *********************************************************/
  setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &one, sizeof(one));
  if (bind(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    fprintf(stderr,"bind: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * put socket into listening state
   *********************************************************/
  if (listen(fd,1) == -1) {
    fprintf(stderr,"listen: %s\n", strerror(errno));
    goto done;
  }

  cfg.listener_fd = fd;
  rc=0;

 done:
  if ((rc < 0) && (fd != -1)) close(fd);
  return rc;
}